

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

bool QCborValueConstRef::comparesEqual_helper(QCborValueConstRef lhs,QCborValue *rhs)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  Element e2;
  Element e1;
  Comparison in_stack_000000f4;
  Element *in_stack_000000f8;
  QCborContainerPrivate *in_stack_00000100;
  Element *in_stack_00000108;
  QCborContainerPrivate *in_stack_00000110;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  QCborValue *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QtCbor::Element>::at
            ((QList<QtCbor::Element> *)in_stack_ffffffffffffffb0,
             CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  QCborContainerPrivate::elementFromValue(in_stack_ffffffffffffffb0);
  iVar2 = compareElementRecursive
                    (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
                     in_stack_000000f4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool
QCborValueConstRef::comparesEqual_helper(QCborValueConstRef lhs, const QCborValue &rhs) noexcept
{
    QtCbor::Element e1 = lhs.d->elements.at(lhs.i);
    QtCbor::Element e2 = QCborContainerPrivate::elementFromValue(rhs);
    return compareElementRecursive(lhs.d, e1, rhs.container, e2, Comparison::ForEquality) == 0;
}